

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

void arma_autocovar(double *phi,double *theta,int p,int q,double var,double *acov,int lag)

{
  size_t sVar1;
  uint N;
  double *x;
  int *ipiv;
  double *A;
  double *b;
  undefined8 *__ptr;
  double *psi;
  undefined8 *__ptr_00;
  void *__src;
  double *pdVar2;
  double *pdVar3;
  undefined8 *puVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint j;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  
  lVar13 = (long)p;
  lVar12 = lVar13 + 1;
  sVar1 = lVar13 * 8 + 8;
  x = (double *)malloc(sVar1);
  ipiv = (int *)malloc(lVar13 * 4 + 4);
  A = (double *)malloc(sVar1 * lVar12);
  b = (double *)malloc(sVar1);
  __ptr = (undefined8 *)malloc(sVar1);
  sVar1 = (long)q * 8 + 8;
  psi = (double *)malloc(sVar1);
  __ptr_00 = (undefined8 *)malloc(sVar1);
  *__ptr = 0xbff0000000000000;
  *__ptr_00 = 0x3ff0000000000000;
  if (0 < p) {
    memcpy(__ptr + 1,phi,(ulong)(uint)p << 3);
  }
  N = p + 1;
  j = q + 1;
  if (0 < q) {
    memcpy(__ptr_00 + 1,theta,(ulong)(uint)q << 3);
  }
  uVar10 = j;
  if (q < p) {
    uVar10 = p;
  }
  __src = malloc((long)(int)uVar10 * 8);
  uVar11 = (ulong)N;
  if (-1 < p) {
    uVar9 = 0;
    pdVar2 = A;
    do {
      uVar6 = uVar9 & 0xffffffff;
      uVar7 = 0;
      do {
        dVar14 = 1.0;
        if (uVar9 != uVar7) {
          dVar14 = 0.0;
        }
        if (uVar9 == 0) {
          dVar14 = 0.0;
        }
        iVar5 = (int)uVar6;
        uVar8 = (ulong)(uint)-iVar5;
        if (0 < iVar5) {
          uVar8 = uVar6;
        }
        pdVar2[uVar7] = dVar14;
        A[uVar9 * uVar11 + uVar8] = A[uVar9 * uVar11 + uVar8] - (double)__ptr[uVar7];
        uVar7 = uVar7 + 1;
        uVar6 = (ulong)(iVar5 - 1);
      } while (uVar11 != uVar7);
      uVar9 = uVar9 + 1;
      pdVar2 = pdVar2 + uVar11;
    } while (uVar9 != uVar11);
  }
  psiweight(phi,theta,psi,p,q,j);
  if (0 < (int)uVar10) {
    uVar9 = 0;
    puVar4 = __ptr_00;
    do {
      dVar14 = 0.0;
      if (-1 < q) {
        uVar6 = 0;
        do {
          if ((long)(uVar9 + uVar6) <= (long)q) {
            dVar14 = dVar14 + (double)puVar4[uVar6] * psi[uVar6];
          }
          uVar6 = uVar6 + 1;
        } while (j != uVar6);
      }
      *(double *)((long)__src + uVar9 * 8) = dVar14 * var;
      uVar9 = uVar9 + 1;
      puVar4 = puVar4 + 1;
    } while (uVar9 != uVar10);
  }
  if (-1 < p) {
    memcpy(b,__src,uVar11 * 8);
  }
  ludecomp(A,N,ipiv);
  linsolve(A,N,b,ipiv,x);
  if (-1 < p) {
    memcpy(acov,x,uVar11 * 8);
  }
  if ((int)N < lag) {
    pdVar2 = acov + lVar13;
    do {
      dVar14 = 0.0;
      if (0 < p) {
        lVar13 = 0;
        pdVar3 = phi;
        do {
          dVar14 = dVar14 + *pdVar3 * pdVar2[lVar13];
          lVar13 = lVar13 + -1;
          pdVar3 = pdVar3 + 1;
        } while (1 - uVar11 != lVar13);
      }
      if (lVar12 < (int)uVar10) {
        dVar14 = dVar14 + *(double *)((long)__src + lVar12 * 8);
      }
      acov[lVar12] = dVar14;
      lVar12 = lVar12 + 1;
      pdVar2 = pdVar2 + 1;
    } while ((int)lVar12 != lag);
  }
  free(__ptr);
  free(__ptr_00);
  free(__src);
  free(psi);
  free(x);
  free(A);
  free(ipiv);
  free(b);
  return;
}

Assistant:

void arma_autocovar(double *phi,double *theta,int p,int q,double var,double* acov, int lag) {
	int i,j,t,m;
	double *tcov,*psi,*A,*b,*ph,*th,*thph;
	int *ipiv;
	int p1;
	double temp;
	
	p1 = p+1;
	tcov = (double*) malloc(sizeof(double) * (p1));
	ipiv = (int*) malloc(sizeof(int) * (p1));
	A = (double*) malloc(sizeof(double) * (p1) * (p1));
	b = (double*) malloc(sizeof(double) * (p1));
	ph = (double*) malloc(sizeof(double) * (p1));
	psi = (double*) malloc(sizeof(double) * (q+1));
	th = (double*) malloc(sizeof(double) * (q+1));

	ph[0] = -1.0;
	th[0] = 1.0;
	
	for(i = 0; i < p;++i) {
		ph[i+1] = phi[i];
	}
	
	for(i = 0; i < q;++i) {
		th[i+1] = theta[i];
	}
	
	if (p >= q+1) {
		m = p;
	} else {
		m = q + 1;
	}
	thph = (double*) malloc(sizeof(double) * m);
	// set A
	for(i = 0; i < p1;++i) {
		for(j=0; j < p1;++j) {
			A[i*p1+j] = 0.;
			if (i == j && i != 0) {
				A[i*p1+j] = 1.;
			}

			t = i - j;
			if (t < 0) {
				t = -t;
			} 
			
			A[i*p1+t] -= ph[j];
			
		}
	}
	
	//set b
	
	psiweight(phi,theta,psi,p,q,q+1);
	for(i=0; i < m;++i) {
		
		temp = 0.;
		for(j = 0; j < q+1;++j) {
			if(i+j < q+1) {
				temp += th[i+j] * psi[j];
			}
		}
		thph[i] = temp*var;
		
	}
	
	for(i=0; i < p1;++i) {
		b[i] = thph[i];
	}
	
	ludecomp(A,p1,ipiv);
	linsolve(A,p1,b,ipiv,tcov);
	
	for(i = 0; i < p1;++i) {
		acov[i] = tcov[i];
	}
	
	for(i = p1; i < lag;++i) {
		temp = 0.0;
		for(j = 1; j < p1; ++j) {
			temp+= phi[j-1] * acov[i - j];
		}
		if (i < m) {
			temp += thph[i];
		}
		acov[i] = temp;
	}
	
	free(ph);
	free(th);
	free(thph);
	free(psi);
	free(tcov);
	free(A);
	free(ipiv);
	free(b);
}